

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-adapter.cpp
# Opt level: O1

llama_adapter_lora * llama_adapter_lora_init(llama_model *model,char *path_lora)

{
  ggml_backend_buffer_type **ppgVar1;
  _Rb_tree_node_base *__rhs;
  pointer pcVar2;
  __node_base *p_Var3;
  _Hash_node_base *p_Var4;
  _Hash_node_base *p_Var5;
  _Alloc_hider _Var6;
  _Head_base<0UL,_gguf_context_*,_false> _Var7;
  uint uVar8;
  int iVar9;
  llm_arch lVar10;
  llama_adapter_lora *plVar11;
  char *pcVar12;
  ggml_tensor *pgVar13;
  size_t sVar14;
  iterator iVar15;
  mapped_type *pmVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  code *pcVar19;
  ggml_backend_buffer_type **__args;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  _Base_ptr p_Var21;
  _Base_ptr p_Var22;
  mapped_type *ppgVar23;
  ggml_tensor *pgVar24;
  mapped_type *pmVar25;
  _Rb_tree_node_base *p_Var26;
  long lVar27;
  long lVar28;
  size_type sVar29;
  runtime_error *prVar30;
  long *plVar31;
  _Base_ptr p_Var32;
  size_type *psVar33;
  undefined4 uVar34;
  bool bVar35;
  float fVar36;
  undefined1 auVar37 [16];
  llama_file gguf_file;
  string adapter_type;
  gguf_context_ptr ctx_gguf;
  vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_> buft_extra;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
  *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
  ab_map;
  ggml_context_ptr ctx;
  map<ggml_backend_buffer_type_*,_ggml_context_*,_std::less<ggml_backend_buffer_type_*>,_std::allocator<std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>_>_>
  ctx_map;
  ggml_context *buft_ctx;
  ggml_context *ctx_init;
  string local_178;
  string local_158;
  _Head_base<0UL,_gguf_context_*,_false> local_130;
  string local_128;
  allocator<char> local_103;
  allocator<char> local_102;
  allocator<char> local_101;
  llama_adapter_lora *local_100;
  ggml_tensor *local_f8;
  undefined1 local_f0 [32];
  _Rb_tree_node_base *local_d0;
  size_t local_c8;
  __uniq_ptr_impl<ggml_context,_ggml_context_deleter> local_c0;
  _Rb_tree_node_base *local_b8;
  undefined4 local_ac;
  undefined1 local_a8 [32];
  _Rb_tree_node_base *local_88;
  size_type local_80;
  llama_adapter_lora *local_78;
  llama_model *local_70;
  __node_base *local_68;
  _Base_ptr local_60;
  char *local_58;
  vector<std::unique_ptr<ggml_context,ggml_context_deleter>,std::allocator<std::unique_ptr<ggml_context,ggml_context_deleter>>>
  *local_50;
  long local_48;
  _Rb_tree_node_base *local_40;
  _Head_base<0UL,_ggml_context_*,_false> local_38;
  
  local_70 = model;
  plVar11 = (llama_adapter_lora *)operator_new(0x70);
  (plVar11->ab_map)._M_h._M_buckets = (__buckets_ptr)0x0;
  (plVar11->ab_map)._M_h._M_bucket_count = 0;
  *(undefined8 *)&(plVar11->ab_map)._M_h._M_rehash_policy = 0;
  (plVar11->ab_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (plVar11->ab_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (plVar11->ctxs).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (plVar11->ctxs).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (plVar11->ctxs).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (plVar11->bufs).
  super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (plVar11->bufs).
  super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (plVar11->bufs).
  super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&plVar11->alpha = 0;
  (plVar11->ab_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (plVar11->ab_map)._M_h._M_element_count = 0;
  (plVar11->ab_map)._M_h._M_buckets = &(plVar11->ab_map)._M_h._M_single_bucket;
  (plVar11->ab_map)._M_h._M_bucket_count = 1;
  (plVar11->ab_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (plVar11->ab_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (plVar11->ab_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (plVar11->ctxs).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (plVar11->ctxs).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (plVar11->ctxs).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (plVar11->bufs).
  super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (plVar11->bufs).
  super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (plVar11->bufs).
  super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100 = plVar11;
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: loading lora adapter from \'%s\' ...\n",
                     "llama_adapter_lora_init_impl",path_lora);
  local_130._M_head_impl = (gguf_context *)gguf_init_from_file(path_lora,1,&local_38);
  if (local_130._M_head_impl == (gguf_context *)0x0) {
    prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f0,path_lora,(allocator<char> *)&local_158);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   "failed to load lora adapter file from ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
    std::runtime_error::runtime_error(prVar30,(string *)local_a8);
    __cxa_throw(prVar30,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_c0._M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
  super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl =
       (tuple<ggml_context_*,_ggml_context_deleter>)
       (tuple<ggml_context_*,_ggml_context_deleter>)local_38._M_head_impl;
  LLM_KV::LLM_KV((LLM_KV *)&local_128,LLM_ARCH_UNKNOWN,(char *)0x0);
  LLM_KV::operator()[abi_cxx11_((string *)local_f0,(LLM_KV *)&local_128,LLM_KV_GENERAL_TYPE);
  uVar8 = gguf_find_key(local_130._M_head_impl,local_f0._0_8_);
  if ((int)uVar8 < 0) {
    local_a8._0_8_ = local_a8 + 0x10;
    local_a8._8_8_ = 0;
    local_a8._16_8_ = local_a8._16_8_ & 0xffffffffffffff00;
  }
  else {
    pcVar12 = (char *)gguf_get_val_str(local_130._M_head_impl,uVar8 & 0x7fffffff);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_a8,pcVar12,&local_103);
  }
  pcVar2 = local_f0 + 0x10;
  if ((pointer)local_f0._0_8_ != pcVar2) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  iVar9 = std::__cxx11::string::compare(local_a8);
  if (iVar9 != 0) {
    prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                   "expect general.type to be \'adapter\', but got: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
    std::runtime_error::runtime_error(prVar30,(string *)local_f0);
    __cxa_throw(prVar30,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  LLM_KV::operator()[abi_cxx11_(&local_158,(LLM_KV *)&local_128,LLM_KV_GENERAL_ARCHITECTURE);
  uVar8 = gguf_find_key(local_130._M_head_impl,local_158._M_dataplus._M_p);
  if ((int)uVar8 < 0) {
    local_f0._8_8_ = 0;
    local_f0._16_8_ = local_f0._16_8_ & 0xffffffffffffff00;
    local_f0._0_8_ = pcVar2;
  }
  else {
    pcVar12 = (char *)gguf_get_val_str(local_130._M_head_impl,uVar8 & 0x7fffffff);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_f0,pcVar12,&local_102);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,(ulong)(local_158.field_2._M_allocated_capacity + 1))
    ;
  }
  lVar10 = llm_arch_from_string((string *)local_f0);
  if (lVar10 != local_70->arch) {
    prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar30,"model arch and LoRA arch mismatch");
    __cxa_throw(prVar30,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  LLM_KV::operator()[abi_cxx11_(&local_178,(LLM_KV *)&local_128,LLM_KV_ADAPTER_TYPE);
  uVar8 = gguf_find_key(local_130._M_head_impl,local_178._M_dataplus._M_p);
  if ((int)uVar8 < 0) {
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    local_158._M_string_length = 0;
    local_158.field_2._M_allocated_capacity =
         local_158.field_2._M_allocated_capacity & 0xffffffffffffff00;
  }
  else {
    pcVar12 = (char *)gguf_get_val_str(local_130._M_head_impl,uVar8 & 0x7fffffff);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,pcVar12,&local_101);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  iVar9 = std::__cxx11::string::compare((char *)&local_158);
  if (iVar9 != 0) {
    prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_178,"expect adapter.type to be \'lora\', but got: ",&local_158);
    std::runtime_error::runtime_error(prVar30,(string *)&local_178);
    __cxa_throw(prVar30,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  LLM_KV::operator()[abi_cxx11_(&local_178,(LLM_KV *)&local_128,LLM_KV_ADAPTER_LORA_ALPHA);
  uVar8 = gguf_find_key(local_130._M_head_impl,local_178._M_dataplus._M_p);
  fVar36 = 0.0;
  if (-1 < (int)uVar8) {
    fVar36 = (float)gguf_get_val_f32(local_130._M_head_impl,uVar8 & 0x7fffffff);
  }
  local_100->alpha = fVar36;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,(ulong)(local_158.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((pointer)local_f0._0_8_ != pcVar2) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
    operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
  }
  local_f8 = (ggml_tensor *)gguf_get_n_tensors(local_130._M_head_impl);
  local_a8._24_8_ = local_a8 + 8;
  local_a8._8_8_ = local_a8._8_8_ & 0xffffffff00000000;
  local_a8._16_8_ = (_Base_ptr)0x0;
  local_80 = 0;
  local_f0._24_8_ = local_f0 + 8;
  local_f0._8_8_ = local_f0._8_8_ & 0xffffffff00000000;
  local_f0._16_8_ = 0;
  local_c8 = 0;
  local_d0 = (_Rb_tree_node_base *)local_f0._24_8_;
  local_88 = (_Rb_tree_node_base *)local_a8._24_8_;
  local_58 = path_lora;
  pgVar13 = (ggml_tensor *)
            ggml_get_first_tensor
                      (local_c0._M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                       super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl);
  local_68 = &(plVar11->ab_map)._M_h._M_before_begin;
  paVar20 = &local_128.field_2;
  local_78 = plVar11;
  for (; pgVar13 != (ggml_tensor *)0x0;
      pgVar13 = (ggml_tensor *)
                ggml_get_next_tensor
                          (local_c0._M_t.
                           super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                           super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,pgVar13)) {
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    sVar14 = strlen(pgVar13->name);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,pgVar13->name,pgVar13->name + sVar14);
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    local_178.field_2._M_allocated_capacity = 0x615f61726f6c2e;
    local_178._M_string_length = 7;
    if (local_158._M_string_length < (_Base_ptr)0x7) {
      bVar35 = false;
    }
    else {
      iVar9 = std::__cxx11::string::compare
                        ((ulong)&local_158,
                         (ulong)((long)&((_Base_ptr)(local_158._M_string_length + -0x20))->_M_right
                                + 1),(string *)0x7);
      bVar35 = iVar9 == 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    if (bVar35) {
      local_178.field_2._M_allocated_capacity = 0x615f61726f6c2e;
      local_178._M_string_length = 7;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity =
           local_128.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_128._M_dataplus._M_p = (pointer)paVar20;
      replace_all(&local_158,&local_178,&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar20) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      iVar15 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
                       *)local_f0,&local_158);
      if (iVar15._M_node == (_Base_ptr)(local_f0 + 8)) {
        pmVar16 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
                                *)local_f0,&local_158);
        pmVar16->a = pgVar13;
        pmVar16->b = (ggml_tensor *)0x0;
      }
      else {
        pmVar16 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
                                *)local_f0,&local_158);
        pmVar16->a = pgVar13;
      }
    }
    else {
      local_178.field_2._M_allocated_capacity = 0x625f61726f6c2e;
      local_178._M_string_length = 7;
      if (local_158._M_string_length < (_Base_ptr)0x7) {
        bVar35 = false;
      }
      else {
        iVar9 = std::__cxx11::string::compare
                          ((ulong)&local_158,
                           (ulong)((long)&((_Base_ptr)(local_158._M_string_length + -0x20))->
                                          _M_right + 1),(string *)0x7);
        bVar35 = iVar9 == 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      if (bVar35) {
        local_178.field_2._M_allocated_capacity = 0x625f61726f6c2e;
        local_178._M_string_length = 7;
        local_128._M_string_length = 0;
        local_128.field_2._M_allocated_capacity =
             local_128.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_128._M_dataplus._M_p = (pointer)paVar20;
        replace_all(&local_158,&local_178,&local_128);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != paVar20) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        iVar15 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
                         *)local_f0,&local_158);
        if (iVar15._M_node == (_Base_ptr)(local_f0 + 8)) {
          pmVar16 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
                                  *)local_f0,&local_158);
          pmVar16->a = (ggml_tensor *)0x0;
        }
        else {
          pmVar16 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
                                  *)local_f0,&local_158);
        }
        pmVar16->b = pgVar13;
      }
      else {
        local_178.field_2._M_allocated_capacity = 0x65772e6d726f6e5f;
        local_178._M_string_length = 0xc;
        local_178.field_2._8_5_ = 0x74686769;
        if (local_158._M_string_length < (_Base_ptr)0xc) {
          bVar35 = false;
        }
        else {
          iVar9 = std::__cxx11::string::compare
                            ((ulong)&local_158,
                             (ulong)((long)&((_Base_ptr)(local_158._M_string_length + -0x20))->
                                            _M_left + 4),(string *)0xc);
          bVar35 = iVar9 == 0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        if (!bVar35) {
          prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_128,"LoRA tensor \'",&local_158);
          plVar31 = (long *)std::__cxx11::string::append((char *)&local_128);
          local_178._M_dataplus._M_p = (pointer)*plVar31;
          psVar33 = (size_type *)(plVar31 + 2);
          if ((size_type *)local_178._M_dataplus._M_p == psVar33) {
            local_178.field_2._M_allocated_capacity = *psVar33;
            local_178.field_2._8_8_ = plVar31[3];
            local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
          }
          else {
            local_178.field_2._M_allocated_capacity = *psVar33;
          }
          local_178._M_string_length = plVar31[1];
          *plVar31 = (long)psVar33;
          plVar31[1] = 0;
          *(undefined1 *)(plVar31 + 2) = 0;
          std::runtime_error::runtime_error(prVar30,(string *)&local_178);
          __cxa_throw(prVar30,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,
                      (ulong)(local_158.field_2._M_allocated_capacity + 1));
    }
  }
  local_128._M_dataplus._M_p = (pointer)0x0;
  local_128._M_string_length = 0;
  local_128.field_2._M_allocated_capacity = 0;
  uVar17 = ggml_backend_dev_by_type(0);
  uVar18 = ggml_backend_dev_backend_reg(uVar17);
  plVar11 = local_78;
  pcVar19 = (code *)ggml_backend_reg_get_proc_address(uVar18,"ggml_backend_dev_get_extra_bufts");
  if (((pcVar19 != (code *)0x0) &&
      (__args = (ggml_backend_buffer_type **)(*pcVar19)(uVar17),
      __args != (ggml_backend_buffer_type **)0x0)) && (*__args != (ggml_backend_buffer_type *)0x0))
  {
    do {
      std::vector<ggml_backend_buffer_type*,std::allocator<ggml_backend_buffer_type*>>::
      emplace_back<ggml_backend_buffer_type*&>
                ((vector<ggml_backend_buffer_type*,std::allocator<ggml_backend_buffer_type*>> *)
                 &local_128,__args);
      ppgVar1 = __args + 1;
      __args = __args + 1;
    } while (*ppgVar1 != (ggml_backend_buffer_type *)0x0);
  }
  if ((_Rb_tree_node_base *)local_f0._24_8_ != (_Rb_tree_node_base *)(local_f0 + 8)) {
    local_48 = (long)(int)local_f8;
    local_50 = (vector<std::unique_ptr<ggml_context,ggml_context_deleter>,std::allocator<std::unique_ptr<ggml_context,ggml_context_deleter>>>
                *)&plVar11->ctxs;
    p_Var26 = (_Rb_tree_node_base *)local_f0._24_8_;
    do {
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      local_178._M_dataplus._M_p = (pointer)0x11;
      local_158._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_158,(ulong)&local_178);
      __rhs = p_Var26 + 1;
      local_158.field_2._M_allocated_capacity = (size_type)local_178._M_dataplus._M_p;
      *(undefined8 *)local_158._M_dataplus._M_p = 0x6d655f6e656b6f74;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p + 8) = 'b';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p + 9) = 'd';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p + 10) = '.';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p + 0xb) = 'w';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p + 0xc) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p + 0xd) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p + 0xe) = 'g';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p + 0xf) = 'h';
      local_158._M_dataplus._M_p[0x10] = 't';
      local_158._M_string_length = (size_type)local_178._M_dataplus._M_p;
      local_158._M_dataplus._M_p[(long)local_178._M_dataplus._M_p] = '\0';
      if (p_Var26[1]._M_parent < local_178._M_dataplus._M_p) {
        uVar34 = 0;
      }
      else {
        iVar9 = std::__cxx11::string::compare
                          ((ulong)__rhs,
                           (long)p_Var26[1]._M_parent - (long)local_178._M_dataplus._M_p,
                           (string *)local_178._M_dataplus._M_p);
        uVar34 = (undefined4)CONCAT71((int7)((ulong)plVar11 >> 8),iVar9 == 0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,
                        (ulong)(local_158.field_2._M_allocated_capacity + 1));
      }
      if ((*(long *)(p_Var26 + 2) == 0) || (p_Var26[2]._M_parent == (_Base_ptr)0x0)) {
        prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_178,"LoRA tensor pair for \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        plVar31 = (long *)std::__cxx11::string::append((char *)&local_178);
        local_158._M_dataplus._M_p = (pointer)*plVar31;
        psVar33 = (size_type *)(plVar31 + 2);
        if ((size_type *)local_158._M_dataplus._M_p == psVar33) {
          local_158.field_2._M_allocated_capacity = *psVar33;
          local_158.field_2._8_8_ = plVar31[3];
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        }
        else {
          local_158.field_2._M_allocated_capacity = *psVar33;
        }
        local_158._M_string_length = plVar31[1];
        *plVar31 = (long)psVar33;
        plVar31[1] = 0;
        *(undefined1 *)(plVar31 + 2) = 0;
        std::runtime_error::runtime_error(prVar30,(string *)&local_158);
        __cxa_throw(prVar30,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pgVar13 = llama_model::get_tensor(local_70,*(char **)__rhs);
      if (pgVar13 == (ggml_tensor *)0x0) {
        prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_178,"LoRA tensor \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        plVar31 = (long *)std::__cxx11::string::append((char *)&local_178);
        local_158._M_dataplus._M_p = (pointer)*plVar31;
        psVar33 = (size_type *)(plVar31 + 2);
        if ((size_type *)local_158._M_dataplus._M_p == psVar33) {
          local_158.field_2._M_allocated_capacity = *psVar33;
          local_158.field_2._8_8_ = plVar31[3];
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        }
        else {
          local_158.field_2._M_allocated_capacity = *psVar33;
        }
        local_158._M_string_length = plVar31[1];
        *plVar31 = (long)psVar33;
        plVar31[1] = 0;
        *(undefined1 *)(plVar31 + 2) = 0;
        std::runtime_error::runtime_error(prVar30,(string *)&local_158);
        __cxa_throw(prVar30,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_f8 = pgVar13;
      local_b8 = __rhs;
      local_ac = uVar34;
      local_40 = p_Var26;
      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)ggml_backend_buffer_get_type(pgVar13->buffer);
      if (local_128._M_dataplus._M_p != (pointer)local_128._M_string_length) {
        pcVar12 = local_f8->name;
        _Var6._M_p = local_128._M_dataplus._M_p;
        do {
          plVar31 = (long *)((long)_Var6._M_p + 8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*(undefined1 **)_Var6._M_p == paVar20) {
            uVar17 = ggml_backend_buft_name(paVar20);
            llama_log_internal(GGML_LOG_LEVEL_WARN,
                               "%s: lora for \'%s\' cannot use buft \'%s\', fallback to CPU\n",
                               "llama_adapter_lora_init_impl",pcVar12,uVar17);
            uVar17 = ggml_backend_dev_by_type(0);
            paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)ggml_backend_dev_buffer_type(uVar17);
            break;
          }
          _Var6._M_p = (pointer)plVar31;
        } while (plVar31 != (long *)local_128._M_string_length);
      }
      uVar17 = ggml_backend_buft_name(paVar20);
      plVar11 = local_78;
      llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: lora for \'%s\' -> \'%s\'\n",
                         "llama_adapter_lora_init_impl",local_f8->name,uVar17);
      p_Var26 = local_40;
      p_Var22 = (_Base_ptr)(local_a8 + 8);
      p_Var21 = p_Var22;
      for (p_Var32 = (_Base_ptr)local_a8._16_8_; p_Var32 != (_Base_ptr)0x0;
          p_Var32 = (&p_Var32->_M_left)[*(undefined1 **)(p_Var32 + 1) < paVar20]) {
        if (*(undefined1 **)(p_Var32 + 1) >= paVar20) {
          p_Var21 = p_Var32;
        }
      }
      p_Var32 = p_Var22;
      if ((p_Var21 != p_Var22) && (p_Var32 = p_Var21, paVar20 < *(undefined1 **)(p_Var21 + 1))) {
        p_Var32 = p_Var22;
      }
      local_178._M_dataplus._M_p = (pointer)paVar20;
      if (p_Var32 == p_Var22) {
        lVar27 = ggml_tensor_overhead();
        pgVar13 = local_f8;
        local_158._M_dataplus._M_p = (pointer)(lVar27 * local_48);
        local_158._M_string_length = 0;
        local_158.field_2._M_local_buf[0] = 1;
        p_Var22 = (_Base_ptr)ggml_init();
        local_60 = p_Var22;
        if (p_Var22 == (_Base_ptr)0x0) {
          p_Var22 = (_Base_ptr)0x0;
        }
        else {
          ppgVar23 = std::
                     map<ggml_backend_buffer_type_*,_ggml_context_*,_std::less<ggml_backend_buffer_type_*>,_std::allocator<std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>_>_>
                     ::operator[]((map<ggml_backend_buffer_type_*,_ggml_context_*,_std::less<ggml_backend_buffer_type_*>,_std::allocator<std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>_>_>
                                   *)local_a8,(key_type *)&local_178);
          *ppgVar23 = (mapped_type)p_Var22;
          std::
          vector<std::unique_ptr<ggml_context,ggml_context_deleter>,std::allocator<std::unique_ptr<ggml_context,ggml_context_deleter>>>
          ::emplace_back<ggml_context*&>(local_50,(ggml_context **)&local_60);
          p_Var22 = local_60;
        }
      }
      else {
        p_Var22 = p_Var32[1]._M_parent;
        pgVar13 = local_f8;
      }
      if ((char)local_ac == '\0') {
        if (((_Base_ptr)pgVar13->ne[0] != *(_Base_ptr *)(*(long *)(p_Var26 + 2) + 0x10)) ||
           ((_Base_ptr)pgVar13->ne[1] != (p_Var26[2]._M_parent)->_M_right)) {
          prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_178,"tensor \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b8);
          plVar31 = (long *)std::__cxx11::string::append((char *)&local_178);
          local_158._M_dataplus._M_p = (pointer)*plVar31;
          psVar33 = (size_type *)(plVar31 + 2);
          if ((size_type *)local_158._M_dataplus._M_p == psVar33) {
            local_158.field_2._M_allocated_capacity = *psVar33;
            local_158.field_2._8_8_ = plVar31[3];
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          }
          else {
            local_158.field_2._M_allocated_capacity = *psVar33;
          }
          local_158._M_string_length = plVar31[1];
          *plVar31 = (long)psVar33;
          plVar31[1] = 0;
          *(undefined1 *)(plVar31 + 2) = 0;
          std::runtime_error::runtime_error(prVar30,(string *)&local_158);
          __cxa_throw(prVar30,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (*(_Base_ptr *)(*(long *)(p_Var26 + 2) + 0x18) != (p_Var26[2]._M_parent)->_M_left) {
          prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar30,
                     "lora_a tensor is not transposed (hint: adapter from \"finetune\" example is no longer supported)"
                    );
          __cxa_throw(prVar30,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else if (((_Base_ptr)pgVar13->ne[0] != (p_Var26[2]._M_parent)->_M_right) ||
              (pgVar13->ne[1] != *(long *)(*(long *)(p_Var26 + 2) + 0x18))) {
        prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_178,"tensor \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                      );
        plVar31 = (long *)std::__cxx11::string::append((char *)&local_178);
        local_158._M_dataplus._M_p = (pointer)*plVar31;
        psVar33 = (size_type *)(plVar31 + 2);
        if ((size_type *)local_158._M_dataplus._M_p == psVar33) {
          local_158.field_2._M_allocated_capacity = *psVar33;
          local_158.field_2._8_8_ = plVar31[3];
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        }
        else {
          local_158.field_2._M_allocated_capacity = *psVar33;
        }
        local_158._M_string_length = plVar31[1];
        *plVar31 = (long)psVar33;
        plVar31[1] = 0;
        *(undefined1 *)(plVar31 + 2) = 0;
        std::runtime_error::runtime_error(prVar30,(string *)&local_158);
        __cxa_throw(prVar30,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pgVar13 = (ggml_tensor *)ggml_dup_tensor(p_Var22,*(undefined8 *)(p_Var26 + 2));
      pgVar24 = (ggml_tensor *)ggml_dup_tensor(p_Var22,p_Var26[2]._M_parent);
      ggml_set_name(pgVar13,*(long *)(p_Var26 + 2) + 0x100);
      ggml_set_name(pgVar24,p_Var26[2]._M_parent + 8);
      pmVar25 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_100,(key_type *)local_b8);
      pmVar25->a = pgVar13;
      pmVar25->b = pgVar24;
      p_Var26 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var26);
    } while (p_Var26 != (_Rb_tree_node_base *)(local_f0 + 8));
  }
  std::
  vector<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ::reserve(&plVar11->ctxs,local_80);
  std::
  vector<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ::reserve(&plVar11->bufs,local_80);
  if ((_Rb_tree_node_base *)local_a8._24_8_ != (_Rb_tree_node_base *)(local_a8 + 8)) {
    p_Var26 = (_Rb_tree_node_base *)local_a8._24_8_;
    do {
      local_158._M_dataplus._M_p =
           (pointer)ggml_backend_alloc_ctx_tensors_from_buft
                              (p_Var26[1]._M_parent,*(undefined8 *)(p_Var26 + 1));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar30,"failed to allocate buffer for lora adapter\n");
        __cxa_throw(prVar30,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar17 = ggml_backend_buffer_name(local_158._M_dataplus._M_p);
      uVar18 = ggml_backend_buffer_get_size(local_158._M_dataplus._M_p);
      auVar37._8_4_ = (int)((ulong)uVar18 >> 0x20);
      auVar37._0_8_ = uVar18;
      auVar37._12_4_ = 0x45300000;
      llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: %10s LoRA buffer size = %8.2f MiB\n",
                         SUB84(((auVar37._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)uVar18) - 4503599627370496.0)) *
                               0.0009765625 * 0.0009765625,0),"llama_adapter_lora_init_impl",uVar17)
      ;
      std::
      vector<std::unique_ptr<ggml_backend_buffer,ggml_backend_buffer_deleter>,std::allocator<std::unique_ptr<ggml_backend_buffer,ggml_backend_buffer_deleter>>>
      ::emplace_back<std::unique_ptr<ggml_backend_buffer,ggml_backend_buffer_deleter>>
                ((vector<std::unique_ptr<ggml_backend_buffer,ggml_backend_buffer_deleter>,std::allocator<std::unique_ptr<ggml_backend_buffer,ggml_backend_buffer_deleter>>>
                  *)&plVar11->bufs,
                 (unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)&local_158);
      std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>::~unique_ptr
                ((unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)&local_158);
      p_Var26 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var26);
    } while (p_Var26 != (_Rb_tree_node_base *)(local_a8 + 8));
  }
  llama_file::llama_file((llama_file *)&local_178,local_58,"rb");
  local_158._M_dataplus._M_p = (pointer)0x0;
  local_158._M_string_length = 0;
  local_158.field_2._M_allocated_capacity = 0;
  while (p_Var3 = local_68->_M_nxt, p_Var3 != (__node_base *)0x0) {
    pmVar16 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
                            *)local_f0,(key_type *)(p_Var3 + 1));
    pgVar13 = pmVar16->a;
    pgVar24 = pmVar16->b;
    p_Var4 = p_Var3[5]._M_nxt;
    p_Var5 = p_Var3[6]._M_nxt;
    local_68 = p_Var3;
    lVar27 = gguf_get_data_offset(local_130._M_head_impl);
    _Var7._M_head_impl = local_130._M_head_impl;
    uVar17 = gguf_find_tensor(local_130._M_head_impl,pgVar13->name);
    lVar28 = gguf_get_tensor_offset(_Var7._M_head_impl,uVar17);
    sVar29 = ggml_nbytes(pgVar13);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_158,sVar29);
    llama_file::seek((llama_file *)&local_178,lVar28 + lVar27,0);
    llama_file::read_raw((llama_file *)&local_178,local_158._M_dataplus._M_p,sVar29);
    ggml_backend_tensor_set(p_Var4,local_158._M_dataplus._M_p,0,sVar29);
    lVar27 = gguf_get_data_offset(local_130._M_head_impl);
    _Var7._M_head_impl = local_130._M_head_impl;
    uVar17 = gguf_find_tensor(local_130._M_head_impl,pgVar24->name);
    lVar28 = gguf_get_tensor_offset(_Var7._M_head_impl,uVar17);
    sVar29 = ggml_nbytes(pgVar24);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_158,sVar29);
    llama_file::seek((llama_file *)&local_178,lVar28 + lVar27,0);
    llama_file::read_raw((llama_file *)&local_178,local_158._M_dataplus._M_p,sVar29);
    ggml_backend_tensor_set(p_Var5,local_158._M_dataplus._M_p,0,sVar29);
  }
  if (local_158._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_158._M_dataplus._M_p,
                    local_158.field_2._M_allocated_capacity - (long)local_158._M_dataplus._M_p);
  }
  llama_file::~llama_file((llama_file *)&local_178);
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: loaded %zu tensors from lora file\n",
                     "llama_adapter_lora_init_impl",(local_100->ab_map)._M_h._M_element_count * 2);
  if ((long *)local_128._M_dataplus._M_p != (long *)0x0) {
    operator_delete(local_128._M_dataplus._M_p,
                    local_128.field_2._M_allocated_capacity - (long)local_128._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
               *)local_f0);
  std::
  _Rb_tree<ggml_backend_buffer_type_*,_std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>,_std::_Select1st<std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>_>,_std::less<ggml_backend_buffer_type_*>,_std::allocator<std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>_>_>
  ::~_Rb_tree((_Rb_tree<ggml_backend_buffer_type_*,_std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>,_std::_Select1st<std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>_>,_std::less<ggml_backend_buffer_type_*>,_std::allocator<std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>_>_>
               *)local_a8);
  std::unique_ptr<ggml_context,_ggml_context_deleter>::~unique_ptr
            ((unique_ptr<ggml_context,_ggml_context_deleter> *)&local_c0);
  std::unique_ptr<gguf_context,_gguf_context_deleter>::~unique_ptr
            ((unique_ptr<gguf_context,_gguf_context_deleter> *)&local_130);
  return local_100;
}

Assistant:

llama_adapter_lora * llama_adapter_lora_init(llama_model * model, const char * path_lora) {
    llama_adapter_lora * adapter = new llama_adapter_lora();

    try {
        llama_adapter_lora_init_impl(*model, path_lora, *adapter);
        return adapter;
    } catch (const std::exception & err) {
        LLAMA_LOG_ERROR("%s: failed to apply lora adapter: %s\n", __func__, err.what());

        delete adapter;
    }

    return nullptr;
}